

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

lu_byte luaH_get(Table *t,TValue *key,TValue *res)

{
  int *piVar1;
  lu_byte lVar2;
  byte bVar3;
  uint uVar4;
  lua_Integer in_RAX;
  TValue *io2;
  Node *pNVar6;
  Node *pNVar7;
  TValue *io1;
  lua_Integer k;
  lua_Integer local_28;
  uint uVar5;
  
  bVar3 = key->tt_ & 0x3f;
  if (bVar3 < 4) {
    pNVar6 = (Node *)&absentkey;
    if ((key->tt_ & 0x3f) == 0) goto LAB_0011b0ac;
    if (bVar3 == 3) {
      lVar2 = luaH_getint(t,(key->value_).i,res);
      return lVar2;
    }
  }
  else if (bVar3 == 0x13) {
    local_28 = in_RAX;
    uVar4 = luaV_flttointeger((key->value_).n,&local_28,F2Ieq);
    uVar5 = uVar4;
    if (uVar4 != 0) {
      bVar3 = luaH_getint(t,local_28,res);
      uVar5 = (uint)bVar3;
    }
    if (uVar4 != 0) {
      return (lu_byte)uVar5;
    }
  }
  else if (bVar3 == 4) {
    pNVar7 = t->node + (~(-1 << (t->lsizenode & 0x1f)) &
                       *(uint *)&((GCObject *)(key->value_).f)->field_0xc);
    do {
      if (((pNVar7->u).key_tt == 'D') &&
         (pNVar6 = pNVar7, (pNVar7->u).key_val.gc == (GCObject *)(key->value_).f)) break;
      piVar1 = &(pNVar7->u).next;
      pNVar7 = pNVar7 + *piVar1;
      pNVar6 = (Node *)&absentkey;
    } while ((long)*piVar1 != 0);
    goto LAB_0011b0ac;
  }
  pNVar6 = (Node *)getgeneric(t,key,0);
LAB_0011b0ac:
  if (((pNVar6->u).tt_ & 0xf) != 0) {
    res->value_ = (pNVar6->u).value_;
    res->tt_ = (pNVar6->u).tt_;
  }
  return (pNVar6->u).tt_ & 0x3f;
}

Assistant:

lu_byte luaH_get (Table *t, const TValue *key, TValue *res) {
  const TValue *slot;
  switch (ttypetag(key)) {
    case LUA_VSHRSTR:
      slot = luaH_Hgetshortstr(t, tsvalue(key));
      break;
    case LUA_VNUMINT:
      return luaH_getint(t, ivalue(key), res);
    case LUA_VNIL:
      slot = &absentkey;
      break;
    case LUA_VNUMFLT: {
      lua_Integer k;
      if (luaV_flttointeger(fltvalue(key), &k, F2Ieq)) /* integral index? */
        return luaH_getint(t, k, res);  /* use specialized version */
      /* else... */
    }  /* FALLTHROUGH */
    default:
      slot = getgeneric(t, key, 0);
      break;
  }
  return finishnodeget(slot, res);
}